

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_algorithms.h
# Opt level: O2

void __thiscall
Labeling2D<(Connectivity2D)4,_false>::Labeling2D(Labeling2D<(Connectivity2D)4,_false> *this)

{
  pointer *__ptr;
  _Head_base<0UL,_YacclabTensorOutput2D_*,_false> local_18;
  unique_ptr<YacclabTensorInput2D,_std::default_delete<YacclabTensorInput2D>_> local_10;
  
  std::make_unique<YacclabTensorInput2D>();
  std::make_unique<YacclabTensorOutput2D>();
  Labeling2D(this,&local_10,
             (unique_ptr<YacclabTensorOutput2D,_std::default_delete<YacclabTensorOutput2D>_> *)
             &local_18);
  if (local_18._M_head_impl != (YacclabTensorOutput2D *)0x0) {
    (*((local_18._M_head_impl)->super_YacclabTensorOutput).super_YacclabTensor._vptr_YacclabTensor
      [2])();
  }
  local_18._M_head_impl = (YacclabTensorOutput2D *)0x0;
  if (local_10._M_t.
      super___uniq_ptr_impl<YacclabTensorInput2D,_std::default_delete<YacclabTensorInput2D>_>._M_t.
      super__Tuple_impl<0UL,_YacclabTensorInput2D_*,_std::default_delete<YacclabTensorInput2D>_>.
      super__Head_base<0UL,_YacclabTensorInput2D_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<YacclabTensorInput2D,_std::default_delete<YacclabTensorInput2D>_>)0x0) {
    (**(code **)(*(long *)local_10._M_t.
                          super___uniq_ptr_impl<YacclabTensorInput2D,_std::default_delete<YacclabTensorInput2D>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_YacclabTensorInput2D_*,_std::default_delete<YacclabTensorInput2D>_>
                          .super__Head_base<0UL,_YacclabTensorInput2D_*,_false>._M_head_impl + 0x10)
    )();
  }
  return;
}

Assistant:

Labeling2D() : Labeling2D(std::make_unique<YacclabTensorInput2D>(), std::make_unique<YacclabTensorOutput2D>()) {}